

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * get_BYTECODE_varname(Context *ctx,RegisterType rt,int regnum)

{
  char *pcVar1;
  size_t in_R8;
  char regnum_str [16];
  char buf [64];
  
  pcVar1 = get_D3D_register_string(ctx,rt,regnum,regnum_str,in_R8);
  snprintf(buf,0x40,"%s%s",pcVar1,regnum_str);
  pcVar1 = StrDup(ctx,buf);
  return pcVar1;
}

Assistant:

static const char *get_BYTECODE_varname(Context *ctx, RegisterType rt, int regnum)
{
    char regnum_str[16];
    const char *regtype_str = get_D3D_register_string(ctx, rt, regnum,
                                              regnum_str, sizeof (regnum_str));
    char buf[64];
    snprintf(buf, sizeof (buf), "%s%s", regtype_str, regnum_str);
    return StrDup(ctx, buf);
}